

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O1

LY_ERR lyb_read_string(char **str,uint8_t len_size,lylyb_ctx *lybctx)

{
  size_t count;
  uint8_t *buf;
  uint uVar1;
  undefined7 in_register_00000031;
  size_t local_28;
  
  uVar1 = (uint)CONCAT71(in_register_00000031,len_size);
  if ((uVar1 < 9) && ((0x114U >> (uVar1 & 0x1f) & 1) != 0)) {
    *str = (char *)0x0;
    local_28 = 0;
    lyb_read((uint8_t *)&local_28,(ulong)len_size,lybctx);
    count = local_28;
    buf = (uint8_t *)malloc(local_28 + 1);
    *str = (char *)buf;
    if (buf == (uint8_t *)0x0) {
      ly_log(lybctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyb_read_string");
    }
    else {
      lyb_read(buf,count,lybctx);
      (*str)[count] = '\0';
    }
    return (LY_ERR)(buf == (uint8_t *)0x0);
  }
  __assert_fail("(len_size == 1) || (len_size == 2) || (len_size == 4) || (len_size == 8)",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                ,0xd6,"LY_ERR lyb_read_string(char **, uint8_t, struct lylyb_ctx *)");
}

Assistant:

static LY_ERR
lyb_read_string(char **str, uint8_t len_size, struct lylyb_ctx *lybctx)
{
    uint64_t len = 0;

    assert((len_size == 1) || (len_size == 2) || (len_size == 4) || (len_size == 8));

    *str = NULL;

    lyb_read_number(&len, sizeof len, len_size, lybctx);

    *str = malloc((len + 1) * sizeof **str);
    LY_CHECK_ERR_RET(!*str, LOGMEM(lybctx->ctx), LY_EMEM);

    lyb_read((uint8_t *)*str, len, lybctx);

    (*str)[len] = '\0';
    return LY_SUCCESS;
}